

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O2

int32_t utrie2_internalU8PrevIndex_63(UTrie2 *trie,UChar32 c,uint8_t *start,uint8_t *src)

{
  long lVar1;
  UChar32 c_00;
  int32_t iVar2;
  long lVar3;
  uint8_t *s;
  int32_t i;
  
  lVar3 = (long)src - (long)start;
  lVar1 = 7;
  if (lVar3 < 8) {
    lVar1 = lVar3;
  }
  s = src + -7;
  if (lVar3 < 8) {
    s = start;
  }
  i = (int)lVar1;
  c_00 = utf8_prevCharSafeBody_63(s,0,&i,c,-1);
  i = (int)lVar1 - i;
  iVar2 = u8Index(trie,c_00,i);
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie2_internalU8PrevIndex(const UTrie2 *trie, UChar32 c,
                           const uint8_t *start, const uint8_t *src) {
    int32_t i, length;
    /* support 64-bit pointers by avoiding cast of arbitrary difference */
    if((src-start)<=7) {
        i=length=(int32_t)(src-start);
    } else {
        i=length=7;
        start=src-7;
    }
    c=utf8_prevCharSafeBody(start, 0, &i, c, -1);
    i=length-i;  /* number of bytes read backward from src */
    return u8Index(trie, c, i);
}